

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  CURLcode CVar1;
  int iVar2;
  time_t tVar3;
  char *__ptr;
  long lVar4;
  _Bool _Var5;
  per_transfer *per;
  _Bool getadded;
  _Bool local_41;
  _Bool *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  local_38 = multi;
  if (((long)(ulong)((uint)global->parallel_max * 2) <= all_pers) ||
     (CVar1 = create_transfer(global,share,addedp), CVar1 == CURLE_OK)) {
    local_40 = morep;
    if (transfers == (per_transfer *)0x0) {
      _Var5 = false;
    }
    else {
      _Var5 = false;
      lVar4 = all_added;
      per = transfers;
      do {
        if ((long)(ulong)global->parallel_max <= lVar4) {
          _Var5 = true;
          break;
        }
        local_41 = false;
        if (per->added == false) {
          if ((per->startat == 0) || (tVar3 = time((time_t *)0x0), per->startat <= tVar3)) {
            per->added = true;
            CVar1 = pre_transfer(global,per);
            if (CVar1 != CURLE_OK) {
              return CVar1;
            }
            __ptr = (char *)malloc(0x100);
            if (__ptr == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            curl_easy_setopt(per->curl,0xed,global->parallel_connect ^ 1);
            curl_easy_setopt(per->curl,0x2777,per);
            curl_easy_setopt(per->curl,0x4efb,xferinfo_cb);
            curl_easy_setopt(per->curl,0x2749,per);
            curl_easy_setopt(per->curl,0x2b,0);
            iVar2 = curl_multi_add_handle(local_38,per->curl);
            if (iVar2 != 0) {
              CVar1 = CURLE_OUT_OF_MEMORY;
LAB_00115a37:
              free(__ptr);
              return CVar1;
            }
            CVar1 = create_transfer(global,share,&local_41);
            if (CVar1 != CURLE_OK) goto LAB_00115a37;
            *__ptr = '\0';
            curl_easy_setopt(per->curl,0x271a,__ptr);
            per->errorbuffer = __ptr;
            per->added = true;
            lVar4 = all_added + 1;
            all_added = lVar4;
            *addedp = true;
          }
          else {
            _Var5 = true;
            lVar4 = all_added;
          }
        }
        per = per->next;
      } while (per != (per_transfer *)0x0);
    }
    CVar1 = CURLE_OK;
    *local_40 = _Var5;
  }
  return CVar1;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    result = create_transfer(global, share, addedp);
    if(result)
      return result;
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result)
      result = create_transfer(global, share, &getadded);
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}